

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O1

Index __thiscall Scope::GetPositionForIndex(Scope *this,Index i)

{
  Index IVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  Index *pIVar4;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  pIVar4 = (this->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  IVar1 = 0;
  do {
    if (*pIVar4 == i) {
      return IVar1;
    }
    IVar1 = IVar1 + 1;
    pIVar4 = pIVar4 + 1;
  } while (pIVar4 != (this->super_SDT).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,"Scope::GetPositionForIndex(Index i=",0x23);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_188);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") not found!",0xc);
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar3 = &PTR__E_0059bd80;
  std::__cxx11::stringbuf::str();
  __cxa_throw(puVar3,&E::typeinfo,E::~E);
}

Assistant:

Index Scope::GetPositionForIndex(Index i) const
{
    SDT::const_iterator it = this->begin();
    Index pos = 0;
    while( *it != i )
    {
        pos++;
        it++;
        if(it == this->end())
        {
            stringstream ss;
            ss << "Scope::GetPositionForIndex(Index i=" << i <<") not found!";
            throw E(ss);
        }

    }
    // *it == i, so...
    return(pos);
}